

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O0

Color * __thiscall Plane::getColor(Plane *this,Vector3 *P)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uchar *in_RCX;
  double in_RDX;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  double in_RSI;
  Vector3 *term;
  Picture *in_RDI;
  Vector3 *pVVar4;
  size_t in_R8;
  double extraout_XMM0_Qa;
  double dVar5;
  double extraout_XMM0_Qa_00;
  double y;
  double x;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  Vector3 *in_stack_ffffffffffffff38;
  Vector3 local_68;
  double local_50;
  Vector3 local_38;
  double local_20;
  double x_00;
  Picture *this_00;
  
  if (*(long *)((long)in_RSI + 0x70) == 0) {
    in_RDI->_vptr_Picture = *(_func_int ***)((long)in_RSI + 8);
    in_RDI->data = *(Vec3b **)((long)in_RSI + 0x10);
    *(double *)&in_RDI->rows = *(double *)((long)in_RSI + 0x18);
  }
  else {
    pVVar4 = &local_38;
    x_00 = in_RSI;
    this_00 = in_RDI;
    operator-(in_stack_ffffffffffffff38,
              (Vector3 *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    Vector3::dot(pVVar4,(Vector3 *)((long)in_RSI + 0xa0));
    std::abs((int)pVVar4);
    dVar5 = Vector3::len2((Vector3 *)((long)in_RSI + 0xa0));
    Vector3::~Vector3(&local_38);
    pVVar4 = &local_68;
    local_20 = extraout_XMM0_Qa / dVar5;
    operator-(in_stack_ffffffffffffff38,
              (Vector3 *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    term = (Vector3 *)((long)in_RSI + 0xb8);
    Vector3::dot(pVVar4,term);
    std::abs((int)pVVar4);
    dVar5 = Vector3::len2((Vector3 *)((long)in_RSI + 0xb8));
    pVVar4 = &local_68;
    Vector3::~Vector3(pVVar4);
    local_50 = extraout_XMM0_Qa_00 / dVar5;
    dVar5 = floor(local_20);
    local_20 = local_20 - dVar5;
    dVar5 = floor(local_50);
    local_50 = local_50 - dVar5;
    uVar2 = sign((EVP_PKEY_CTX *)pVVar4,(uchar *)term,siglen,in_RCX,in_R8);
    bVar1 = false;
    if (-1 < (int)uVar2) {
      uVar2 = sign((EVP_PKEY_CTX *)pVVar4,(uchar *)term,siglen_00,(uchar *)(ulong)uVar2,in_R8);
      bVar1 = false;
      if (-1 < (int)uVar2) {
        uVar2 = sign((EVP_PKEY_CTX *)pVVar4,(uchar *)term,siglen_01,(uchar *)(ulong)uVar2,in_R8);
        bVar1 = false;
        if ((int)uVar2 < 1) {
          iVar3 = sign((EVP_PKEY_CTX *)pVVar4,(uchar *)term,siglen_02,(uchar *)(ulong)uVar2,in_R8);
          bVar1 = iVar3 < 1;
        }
      }
    }
    if (!bVar1) {
      __assert_fail("sign(x) >= 0 && sign(y) >=0 && sign(x - 1) <= 0 && sign(y - 1) <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Plane.cpp"
                    ,0x3b,"virtual Color Plane::getColor(const Vector3 &)");
    }
    Picture::getColor(this_00,x_00,in_RDX);
  }
  return (Color *)in_RDI;
}

Assistant:

Color Plane::getColor(const Vector3 &P)
{
    if (texture.data == NULL) return color;
    double x = std::abs((P - O).dot(Dx)) / Dx.len2(), y = std::abs((P - O).dot(Dy)) / Dy.len2();
    x -= floor(x); y -= floor(y);
#ifdef DEBUG
    assert(sign(x) >= 0 && sign(y) >=0 && sign(x - 1) <= 0 && sign(y - 1) <= 0);
#endif
    return texture.getColor(x, y);
}